

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool __thiscall BasePort::SetProtocol(BasePort *this,ProtocolType prot)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  ProtocolType prot_local;
  BasePort *this_local;
  
  if (prot != PROTOCOL_SEQ_RW) {
    if ((this->IsAllBoardsBroadcastCapable_ & 1U) == 0) {
      poVar2 = std::operator<<(this->outStr,"BasePort::SetProtocol");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"***Error: not all boards support broadcasting, ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"          please upgrade your firmware");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      return false;
    }
    bVar1 = IsBroadcastFirmwareMixValid(this);
    if (!bVar1) {
      poVar2 = std::operator<<(this->outStr,"BasePort::SetProtocol");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,
                               "***Error: cannot use broadcast mode with this mix of firmware, ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"          please upgrade your firmware");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      return false;
    }
  }
  if (prot == PROTOCOL_SEQ_RW) {
    poVar2 = std::operator<<(this->outStr,
                             "BasePort::SetProtocol: system running in NON broadcast mode");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this->Protocol_ = PROTOCOL_SEQ_RW;
  }
  else if (prot == PROTOCOL_SEQ_R_BC_W) {
    poVar2 = std::operator<<(this->outStr,
                             "BasePort::SetProtocol: system running with broadcast write");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this->Protocol_ = PROTOCOL_SEQ_R_BC_W;
  }
  else if (prot == PROTOCOL_BC_QRW) {
    poVar2 = std::operator<<(this->outStr,
                             "BasePort::SetProtocol: system running with broadcast query, read, and write"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this->Protocol_ = PROTOCOL_BC_QRW;
  }
  else {
    poVar2 = std::operator<<(this->outStr,
                             "BasePort::SetProtocol: warning: unknown protocol (ignored): ");
    this_00 = (void *)std::ostream::operator<<(poVar2,prot);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return this->Protocol_ == prot;
}

Assistant:

bool BasePort::SetProtocol(ProtocolType prot) {
    if (prot != BasePort::PROTOCOL_SEQ_RW) {
        if (!IsAllBoardsBroadcastCapable_) {
            outStr << "BasePort::SetProtocol" << std::endl
                   << "***Error: not all boards support broadcasting, " << std::endl
                   << "          please upgrade your firmware"  << std::endl;
            return false;
        }
        if (!IsBroadcastFirmwareMixValid()) {
            outStr << "BasePort::SetProtocol" << std::endl
                   << "***Error: cannot use broadcast mode with this mix of firmware, " << std::endl
                   << "          please upgrade your firmware" << std::endl;
            return false;
        }
    }
    switch (prot) {
        case BasePort::PROTOCOL_SEQ_RW:
            outStr << "BasePort::SetProtocol: system running in NON broadcast mode" << std::endl;
            Protocol_ = prot;
            break;
        case BasePort::PROTOCOL_SEQ_R_BC_W:
            outStr << "BasePort::SetProtocol: system running with broadcast write" << std::endl;
            Protocol_ = prot;
            break;
        case BasePort::PROTOCOL_BC_QRW:
            outStr << "BasePort::SetProtocol: system running with broadcast query, read, and write" << std::endl;
            Protocol_ = prot;
            break;
        default:
            outStr << "BasePort::SetProtocol: warning: unknown protocol (ignored): " << prot << std::endl;
            break;
    }
    return (Protocol_ == prot);
}